

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O1

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,error_code *code,int condition)

{
  undefined4 uVar1;
  std_category *psVar2;
  undefined1 uVar3;
  int iVar4;
  std_category *psVar5;
  error_category *peVar6;
  long lVar7;
  error_category *peVar8;
  error_code bc;
  undefined4 local_40 [2];
  error_category *local_38;
  
  psVar2 = *(std_category **)(code + 8);
  if (psVar2 == this) {
    local_40[0] = *(undefined4 *)code;
    peVar6 = this->pc_;
    local_38 = peVar6;
  }
  else {
    psVar5 = (std_category *)std::_V2::generic_category();
    if ((psVar2 == psVar5) || (peVar6 = generic_category(), psVar2 == &peVar6->std_cat_)) {
      uVar1 = *(undefined4 *)code;
      local_38 = generic_category();
      local_40[0] = uVar1;
    }
    else {
      lVar7 = __dynamic_cast(*(undefined8 *)(code + 8),&std::_V2::error_category::typeinfo,&typeinfo
                             ,0);
      if (lVar7 == 0) {
        peVar6 = this->pc_;
        peVar8 = generic_category();
        if (peVar6 != peVar8) {
          return false;
        }
        uVar3 = (**(code **)(*(long *)psVar5 + 0x38))(psVar5,code,condition);
        return (bool)uVar3;
      }
      local_38 = *(error_category **)(lVar7 + 8);
      local_40[0] = *(undefined4 *)code;
    }
    peVar6 = this->pc_;
  }
  iVar4 = (*peVar6->_vptr_error_category[6])(peVar6,local_40,(ulong)(uint)condition);
  return (bool)(char)iVar4;
}

Assistant:

inline bool error_category::std_category::equivalent( const std::error_code & code,
      int condition ) const BOOST_NOEXCEPT
    {
      if( code.category() == *this )
      {
        boost::system::error_code bc( code.value(), *pc_ );
        return pc_->equivalent( bc, condition );
      }
      else if( code.category() == std::generic_category()
        || code.category() == boost::system::generic_category() )
      {
        boost::system::error_code bc( code.value(),
          boost::system::generic_category() );

        return pc_->equivalent( bc, condition );
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &code.category() ) )
      {
        boost::system::error_code bc( code.value(), *pc2->pc_ );
        return pc_->equivalent( bc, condition );
      }
#endif
      else if( *pc_ == boost::system::generic_category() )
      {
        return std::generic_category().equivalent( code, condition );
      }
      else
      {
        return false;
      }
    }